

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

Aig_Man_t * Saig_ManDualRail(Aig_Man_t *p,int fMiter)

{
  ulong uVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  undefined8 *puVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  void *pvVar5;
  int iVar6;
  int iVar7;
  
  Aig_ManCleanData(p);
  Aig_ManCleanNext(p);
  p_00 = Aig_ManStart(p->vObjs->nSize << 2);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  (p->pConst1->field_5).pData = (void *)((ulong)p_00->pConst1 ^ 1);
  p->pConst1->field_0 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0)p_00->pConst1;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(p->vCis,iVar7);
    pAVar4 = Aig_ObjCreateCi(p_00);
    puVar3[5] = pAVar4;
    pAVar4 = Aig_ObjCreateCi(p_00);
    *puVar3 = pAVar4;
  }
  for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
      Saig_AndDualRail(p_00,pAVar4,(Aig_Obj_t **)&(pAVar4->field_5).pData,(Aig_Obj_t **)pAVar4);
    }
  }
  if (fMiter == 0) {
    for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar5 = Vec_PtrEntry(p->vCos,iVar7);
      uVar1 = *(ulong *)((long)pvVar5 + 8);
      if ((uVar1 & 1) == 0) {
        Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar1 + 0x28));
        puVar3 = (undefined8 *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe);
      }
      else {
        Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar1 & 0xfffffffffffffffe));
        puVar3 = (undefined8 *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x28);
      }
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)*puVar3);
    }
    iVar7 = p->nRegs;
  }
  else {
    pAVar4 = p_00->pConst1;
    for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
      puVar3 = (undefined8 *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar7);
      p1 = Aig_Or(p_00,(Aig_Obj_t *)puVar3[5],(Aig_Obj_t *)*puVar3);
      pAVar4 = Aig_And(p_00,pAVar4,p1);
    }
    Aig_ObjCreateCo(p_00,pAVar4);
    for (iVar6 = 0; iVar7 = p->nRegs, iVar6 < iVar7; iVar6 = iVar6 + 1) {
      pvVar5 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar6);
      uVar1 = *(ulong *)((long)pvVar5 + 8);
      if ((uVar1 & 1) == 0) {
        Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar1 + 0x28));
        puVar3 = (undefined8 *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe);
      }
      else {
        Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)(uVar1 & 0xfffffffffffffffe));
        puVar3 = (undefined8 *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x28);
      }
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)*puVar3);
    }
  }
  Aig_ManSetRegNum(p_00,iVar7 * 2);
  Aig_ManCleanData(p);
  Aig_ManCleanNext(p);
  Aig_ManCleanup(p_00);
  iVar7 = Aig_ManCheck(p_00);
  if (iVar7 == 0) {
    puts("Aig_ManDupSimple(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDualRail( Aig_Man_t * p, int fMiter )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    Aig_ManCleanData( p );
    Aig_ManCleanNext( p );
    // create the new manager
    pNew = Aig_ManStart( 4*Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs 
    Aig_ManConst1(p)->pData = Aig_ManConst0(pNew);
    Aig_ManConst1(p)->pNext = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pNew );
        pObj->pNext = Aig_ObjCreateCi( pNew );
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        Saig_AndDualRail( pNew, pObj, (Aig_Obj_t **)&pObj->pData, &pObj->pNext );
    // add the POs
    if ( fMiter )
    {
        pMiter = Aig_ManConst1(pNew);
        Saig_ManForEachLo( p, pObj, i )
        {
            pMiter = Aig_And( pNew, pMiter, 
                Aig_Or(pNew, (Aig_Obj_t *)pObj->pData, pObj->pNext) );
        } 
        Aig_ObjCreateCo( pNew, pMiter );
        Saig_ManForEachLi( p, pObj, i )
        {
            if ( !Aig_ObjFaninC0(pObj) )
            {
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
            }
            else
            {
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
            }
        }
    }
    else
    {
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( !Aig_ObjFaninC0(pObj) )
            {
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
            }
            else
            {
                Aig_ObjCreateCo( pNew, Aig_ObjFanin0(pObj)->pNext );
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
            }
        }
    }
    Aig_ManSetRegNum( pNew, 2*Aig_ManRegNum(p) );
    Aig_ManCleanData( p );
    Aig_ManCleanNext( p );
    Aig_ManCleanup( pNew );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}